

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiver.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_type sVar1;
  SDKResult SVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar3;
  int iVar4;
  OutputWorker *pOVar5;
  uint64_t uVar6;
  int *piVar7;
  uint64_t uVar8;
  char *__end;
  string hostname;
  SDKJsonResult result;
  MyClient client;
  string local_2b0;
  SDKJsonResult local_290;
  char *local_268;
  long local_260;
  char local_258 [16];
  undefined1 local_248 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  ostringstream local_238 [112];
  ios_base local_1c8 [264];
  MyClient local_c0;
  
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"127.0.0.1","");
  sVar1 = local_2b0._M_string_length;
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_2b0,0,(char *)sVar1,(ulong)__s);
    if ((int)Logger.ChannelMinLevel < 3) {
      local_248 = (undefined1  [8])Logger.ChannelName;
      local_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_240._4_4_,2);
      std::__cxx11::ostringstream::ostringstream(local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Server hostname: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,", port: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238," - Also broadcasting on the LAN to find server",0x2e);
      pOVar5 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_248);
      std::__cxx11::ostringstream::~ostringstream(local_238);
      std::ios_base::~ios_base(local_1c8);
    }
  }
  tonk::SDKSocket::SDKSocket(&local_c0.super_SDKSocket);
  local_c0.super_SDKSocket._vptr_SDKSocket = (_func_int **)&PTR__SDKSocket_0010aae8;
  local_c0.GotAdvertisementPong = false;
  local_c0.Complete._M_base._M_i = (__atomic_base<bool>)0x0;
  bVar3 = MyClient::Initialize(&local_c0);
  if (bVar3) {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001044eb;
    local_248 = (undefined1  [8])Logger.ChannelName;
    local_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_240._4_4_,1);
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"File sending client started",0x1b);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_248);
  }
  else {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001044eb;
    local_248 = (undefined1  [8])Logger.ChannelName;
    local_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_240._4_4_,1);
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"File sending server failed to start",0x23);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_248);
  }
  std::__cxx11::ostringstream::~ostringstream(local_238);
  std::ios_base::~ios_base(local_1c8);
LAB_001044eb:
  local_290._0_8_ = &local_c0;
  std::__shared_ptr<MyClientConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<MyClientConnection>,MyClient*>
            ((__shared_ptr<MyClientConnection,(__gnu_cxx::_Lock_policy)2> *)local_248,
             (allocator<MyClientConnection> *)&local_268,(MyClient **)&local_290);
  this = local_240;
  tonk::SDKSocket::Connect
            (&local_290,&local_c0.super_SDKSocket,(SDKConnection *)local_248,&local_2b0,0x285d);
  SVar2.Result = local_290.super_SDKResult.Result;
  if (local_290.super_SDKResult.Result != Tonk_Success) {
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_290.ErrorJson._M_dataplus._M_p,
               local_290.ErrorJson._M_dataplus._M_p + local_290.ErrorJson._M_string_length);
    if ((int)Logger.ChannelMinLevel < 3) {
      local_248 = (undefined1  [8])Logger.ChannelName;
      local_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_240._4_4_,2);
      std::__cxx11::ostringstream::ostringstream(local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Client connection failed: ",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238," - Going to advertise on the LAN looking for connections",
                 0x38);
      pOVar5 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_248);
      std::__cxx11::ostringstream::~ostringstream(local_238);
      std::ios_base::~ios_base(local_1c8);
    }
    if (local_268 != local_258) {
      operator_delete(local_268);
    }
  }
  if (local_290.ErrorJson._M_dataplus._M_p != (pointer)((long)&local_290 + 0x18U)) {
    operator_delete(local_290.ErrorJson._M_dataplus._M_p);
  }
  if ((local_c0._136_2_ & 0x100) == 0) {
    uVar8 = 0;
    do {
      uVar6 = tonk_time();
      if (1000000 < uVar6 - uVar8) {
        local_290.super_SDKResult.Result._0_1_ = 100;
        uVar8 = uVar6;
        if (SVar2.Result != Tonk_Success) {
          local_248 = (undefined1  [8])local_238;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"","");
          tonk::SDKSocket::Advertise
                    (&local_c0.super_SDKSocket,(string *)local_248,0x285d,&local_290,1);
          if (local_248 != (undefined1  [8])local_238) {
            operator_delete((void *)local_248);
          }
        }
      }
      local_248 = (undefined1  [8])0x0;
      local_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x989680;
      do {
        iVar4 = nanosleep((timespec *)local_248,(timespec *)local_248);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
    } while ((local_c0._136_2_ & 0x100) == 0);
  }
  if ((int)Logger.ChannelMinLevel < 2) {
    local_248 = (undefined1  [8])Logger.ChannelName;
    local_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_240._4_4_,1);
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Client shutdown",0xf);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  tonk::SDKSocket::~SDKSocket(&local_c0.super_SDKSocket);
  if ((int)Logger.ChannelMinLevel < 2) {
    local_248 = (undefined1  [8])Logger.ChannelName;
    local_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_240._4_4_,1);
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"Press ENTER key to terminate",0x1c);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    local_248 = (undefined1  [8])Logger.ChannelName;
    local_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_240._4_4_,1);
    std::__cxx11::ostringstream::ostringstream(local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"...Key press detected.  Terminating..",0x25);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    std::string hostname = "127.0.0.1";

    if (argc >= 2) {
        hostname = argv[1];
        Logger.Info("Server hostname: ", hostname, ", port: ", kFileSenderServerPort,
            " - Also broadcasting on the LAN to find server");
    }

    {
        MyClient client;

        if (client.Initialize()) {
            Logger.Debug("File sending client started");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        bool connectionFailed = true;

        std::shared_ptr<MyClientConnection> connection;

        {
            connection = std::make_shared<MyClientConnection>(&client);

            tonk::SDKJsonResult result = client.Connect(connection.get(), hostname, kFileSenderServerPort);

            if (result.Failed())
            {
                Logger.Info("Client connection failed: ", result.ToString(),
                    " - Going to advertise on the LAN looking for connections");
            }
            else
            {
                connectionFailed = false;
            }
        }

        uint64_t LastAdvertisementUsec = 0;

        while (!client.Complete)
        {
            uint64_t nowUsec = tonk_time();

            if (nowUsec - LastAdvertisementUsec > 1000 * 1000)
            {
                LastAdvertisementUsec = nowUsec;

                uint8_t data[1] = {
                    100
                };

                // Broadcast looking for server on LAN if connection failed
                if (connectionFailed) {
                    client.Advertise(TONK_BROADCAST, kFileSenderServerPort, data, 1);
                }
            }

            std::this_thread::sleep_for(std::chrono::milliseconds(10));
        }

        Logger.Debug("Client shutdown");
    }

    Logger.Debug("Press ENTER key to terminate");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}